

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# glsFragmentOpUtil.cpp
# Opt level: O1

ConstPixelBufferAccess *
deqp::gls::FragmentOpUtil::getMultisampleAccess
          (ConstPixelBufferAccess *__return_storage_ptr__,ConstPixelBufferAccess *original)

{
  int height;
  int depth;
  int rowPitch;
  
  height = (original->m_size).m_data[0];
  depth = (original->m_size).m_data[1];
  rowPitch = tcu::TextureFormat::getPixelSize(&original->m_format);
  tcu::ConstPixelBufferAccess::ConstPixelBufferAccess
            (__return_storage_ptr__,&original->m_format,1,height,depth,rowPitch,
             (original->m_pitch).m_data[1],original->m_data);
  return __return_storage_ptr__;
}

Assistant:

tcu::ConstPixelBufferAccess getMultisampleAccess(const tcu::ConstPixelBufferAccess& original)
{
	return tcu::ConstPixelBufferAccess(original.getFormat(),
									   1,
									   original.getWidth(),
									   original.getHeight(),
									   original.getFormat().getPixelSize(),
									   original.getRowPitch(),
									   original.getDataPtr());
}